

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGeneratorMocUic::JobParseT::ParseMocHeader(JobParseT *this,WorkerT *wrk,MetaT *meta)

{
  pointer pcVar1;
  _Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false> _Var2;
  MetaT *content;
  bool bVar3;
  JobMocT *this_00;
  JobHandleT jobHandle;
  string macroName;
  _Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false> local_e0;
  string local_d8;
  MetaT *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  MocSettingsT::FindMacro(&local_90,&wrk->Gen_->Moc_,&meta->Content);
  if (local_90._M_string_length == 0) {
    bVar3 = true;
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    pcVar1 = (this->FileName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + (this->FileName)._M_string_length);
    local_a8 = 0;
    local_a0 = 0;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_b8 = meta;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    this_00 = (JobMocT *)operator_new(0xc0);
    local_50.field_2._M_allocated_capacity = CONCAT71(uStack_9f,local_a0);
    local_50.field_2._8_8_ = uStack_98;
    local_50._M_string_length = 0;
    local_a8 = 0;
    local_a0 = 0;
    local_b0 = &local_a0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    JobMocT::JobMocT(this_00,&local_d8,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    content = local_b8;
    local_e0._M_head_impl = (JobT *)this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_head_impl = local_e0._M_head_impl;
    MocSettingsT::FindDependencies
              (&wrk->Gen_->Moc_,&content->Content,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_e0._M_head_impl + 0x12));
    *(bool *)(_Var2._M_head_impl + 0x11) = true;
    bVar3 = ParallelJobPushMoc(wrk->Gen_,(JobHandleT *)&local_e0);
    if ((JobMocT *)local_e0._M_head_impl != (JobMocT *)0x0) {
      (*((JobT *)&(local_e0._M_head_impl)->_vptr_JobT)->_vptr_JobT[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobParseT::ParseMocHeader(WorkerT& wrk,
                                                        MetaT const& meta)
{
  bool success = true;
  std::string const macroName = wrk.Moc().FindMacro(meta.Content);
  if (!macroName.empty()) {
    JobHandleT jobHandle = cm::make_unique<JobMocT>(
      std::string(FileName), std::string(), std::string());
    // Read dependencies from this source
    static_cast<JobMocT&>(*jobHandle).FindDependencies(wrk, meta.Content);
    success = wrk.Gen().ParallelJobPushMoc(jobHandle);
  }
  return success;
}